

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Checks.h
# Opt level: O0

void UnitTest::CheckEqual<char[1],FIX::SenderCompID>
               (TestResults *results,char (*expected) [1],SenderCompID *actual,TestDetails *details)

{
  undefined8 test;
  bool bVar1;
  ostream *poVar2;
  char *failure;
  undefined1 local_1c0 [8];
  MemoryOutStream stream;
  TestDetails *details_local;
  SenderCompID *actual_local;
  char (*expected_local) [1];
  TestResults *results_local;
  
  stream._400_8_ = details;
  bVar1 = FIX::operator==(*expected,&actual->super_StringField);
  if (!bVar1) {
    MemoryOutStream::MemoryOutStream((MemoryOutStream *)local_1c0);
    poVar2 = std::operator<<((ostream *)local_1c0,"Expected ");
    poVar2 = std::operator<<(poVar2,*expected);
    poVar2 = std::operator<<(poVar2," but was ");
    FIX::operator<<(poVar2,(FieldBase *)actual);
    test = stream._400_8_;
    failure = MemoryOutStream::GetText((MemoryOutStream *)local_1c0);
    TestResults::OnTestFailure(results,(TestDetails *)test,failure);
    MemoryOutStream::~MemoryOutStream((MemoryOutStream *)local_1c0);
  }
  return;
}

Assistant:

void CheckEqual(TestResults& results, Expected const& expected, Actual const& actual, TestDetails const& details)
{
    if (!(expected == actual))
    {
        UnitTest::MemoryOutStream stream;
        stream << "Expected " << expected << " but was " << actual;

        results.OnTestFailure(details, stream.GetText());
    }
}